

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O2

int __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::unlink
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,char *__name)

{
  long lVar1;
  long lVar2;
  int extraout_EAX;
  int iVar3;
  LinkType u;
  long extraout_RAX;
  long extraout_RAX_00;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  LinkType nilParent;
  LinkType local_50;
  LinkType local_48;
  long local_40;
  ulong local_38;
  
  local_50 = -1;
  lVar1 = this[2].rootNode[1];
  if (__name == (char *)0xffffffffffffffff) {
    bVar8 = true;
  }
  else {
    bVar8 = -1 < *(long *)(lVar1 + 0x88 + (long)__name * 0x90);
  }
  lVar7 = (long)__name * 0x90;
  lVar4 = *(long *)(lVar1 + 0x78 + lVar7);
  lVar1 = *(long *)(lVar1 + 0x80 + lVar7);
  if (lVar4 == -1) {
    transplant(this,(LinkType)__name,lVar1,&local_50);
    lVar5 = extraout_RAX;
    goto joined_r0x002d3def;
  }
  if (lVar1 == -1) {
    transplant(this,(LinkType)__name,lVar4,&local_50);
    lVar5 = extraout_RAX_00;
    lVar1 = lVar4;
    goto joined_r0x002d3def;
  }
  u = first(this,lVar1);
  lVar4 = this[2].rootNode[1];
  if (u == -1) {
    uVar6 = *(ulong *)(lVar4 + -8);
    bVar8 = true;
  }
  else {
    uVar6 = *(ulong *)(lVar4 + 0x88 + u * 0x90);
    bVar8 = -1 < (long)uVar6;
  }
  lVar5 = u * 0x90;
  lVar1 = *(long *)(lVar4 + 0x80 + lVar5);
  local_38 = 0x7fffffffffffffff;
  local_40 = lVar5;
  if ((char *)((uVar6 & 0x7fffffffffffffff) - 1) == __name) {
    lVar2 = lVar1;
    if (lVar1 != -1) goto LAB_002d3e9a;
    uVar6 = u + 1;
    local_50 = u;
  }
  else {
    local_48 = u;
    transplant(this,u,lVar1,&local_50);
    lVar4 = this[2].rootNode[1];
    lVar2 = *(long *)(lVar4 + 0x80 + lVar7);
    *(long *)(lVar4 + 0x80 + lVar5) = lVar2;
    u = local_48;
LAB_002d3e9a:
    uVar6 = u + 1;
    *(ulong *)(lVar4 + 0x88 + lVar2 * 0x90) =
         *(ulong *)(lVar4 + 0x88 + lVar2 * 0x90) & 0x8000000000000000 | uVar6;
  }
  transplant(this,(LinkType)__name,u,&local_50);
  lVar5 = this[2].rootNode[1];
  lVar4 = *(long *)(lVar5 + 0x78 + lVar7);
  *(long *)(lVar5 + 0x78 + local_40) = lVar4;
  lVar4 = lVar4 * 0x90;
  *(ulong *)(lVar5 + 0x88 + lVar4) = *(ulong *)(lVar5 + 0x88 + lVar4) & 0x8000000000000000 | uVar6;
  *(ulong *)(lVar5 + 0x88 + local_40) =
       *(ulong *)(lVar5 + 0x88 + lVar7) & 0x8000000000000000 |
       local_38 & *(ulong *)(lVar5 + 0x88 + local_40);
joined_r0x002d3def:
  iVar3 = (int)lVar5;
  if (bVar8) {
    deleteFixup(this,lVar1,local_50);
    iVar3 = extraout_EAX;
  }
  return iVar3;
}

Assistant:

void unlink(LinkType z) {
    LinkType nilParent = kNoLink;
    LinkType y = z;
    bool yWasBlack = isBlack(y);
    LinkType x;

    if (getChild(z, kLeft) == kNoLink) {
      x = getChild(z, kRight);
      transplant(z, x, nilParent);
    } else if (getChild(z, kRight) == kNoLink) {
      x = getChild(z, kLeft);
      transplant(z, x, nilParent);
    } else {
      y = first(getChild(z, kRight));
      yWasBlack = isBlack(y);
      x = getChild(y, kRight);
      if (getParent(y) == z) {
        if (x == kNoLink)
          nilParent = y;
        else
          setParent(x, y);
      } else {
        transplant(y, getChild(y, kRight), nilParent);
        LinkType zRight = getChild(z, kRight);
        setChild(y, kRight, zRight);
        setParent(zRight, y);
      }
      transplant(z, y, nilParent);
      LinkType zLeft = getChild(z, kLeft);
      setChild(y, kLeft, zLeft);
      setParent(zLeft, y);
      setColor(y, getColor(z));
    }

    if (yWasBlack) deleteFixup(x, nilParent);
  }